

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall
cmake::GetSystemInformation
          (cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmState *this_00;
  bool bVar3;
  bool bVar4;
  int iVar5;
  pointer pbVar6;
  long lVar7;
  cmGlobalGenerator *gg;
  char *pcVar8;
  ostream *poVar9;
  FILE *__stream;
  size_t sVar10;
  bool in_DL;
  uint uVar11;
  ulong uVar12;
  string *psVar13;
  string destPath;
  string modulesPath;
  string resultFile;
  string outFile;
  string inFile;
  string cwd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args2;
  string resultArg;
  string arg;
  string local_1138;
  string local_1118;
  string local_10f8;
  long *local_10d8;
  long local_10d0;
  long local_10c8 [2];
  long *local_10b8;
  long local_10b0;
  long local_10a8 [2];
  string local_1098;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1078;
  value_type local_1058;
  string local_1038 [128];
  
  local_10f8._M_dataplus._M_p = (pointer)&local_10f8.field_2;
  local_10f8._M_string_length = 0;
  local_10f8.field_2._M_local_buf[0] = '\0';
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&local_1098,(SystemTools *)0x1,in_DL);
  local_1138._M_dataplus._M_p = (pointer)&local_1138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1138,local_1098._M_dataplus._M_p,
             local_1098._M_dataplus._M_p + local_1098._M_string_length);
  std::__cxx11::string::append((char *)&local_1138);
  cmsys::SystemTools::RemoveADirectory(&local_1138);
  bVar3 = cmsys::SystemTools::MakeDirectory(local_1138._M_dataplus._M_p);
  if (bVar3) {
    pbVar6 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar3 = true;
    paVar1 = &local_1038[0].field_2;
    if (0x20 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6)) {
      uVar12 = 1;
      bVar3 = true;
      do {
        uVar11 = (uint)uVar12;
        pcVar2 = pbVar6[uVar12]._M_dataplus._M_p;
        local_1038[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1038,pcVar2,pcVar2 + pbVar6[uVar12]._M_string_length);
        lVar7 = std::__cxx11::string::find((char *)local_1038,0x4aecf8,0);
        if (lVar7 == 0) {
          this->Verbose = true;
          bVar4 = true;
        }
        else {
          lVar7 = std::__cxx11::string::find((char *)local_1038,0x4aef58,0);
          if (lVar7 == 0) {
            std::__cxx11::string::substr((ulong)&local_1118,(ulong)local_1038);
            if (local_1118._M_string_length == 0) {
              uVar11 = uVar11 + 1;
              if ((ulong)uVar11 <
                  (ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5)) {
                std::__cxx11::string::_M_assign((string *)&local_1118);
                goto LAB_002421a9;
              }
              cmSystemTools::Error
                        ("No generator specified for -G",(char *)0x0,(char *)0x0,(char *)0x0);
              PrintGeneratorList(this);
              bVar4 = false;
            }
            else {
LAB_002421a9:
              gg = CreateGlobalGenerator(this,&local_1118);
              if (gg == (cmGlobalGenerator *)0x0) {
                cmSystemTools::Error
                          ("Could not create named generator ",local_1118._M_dataplus._M_p,
                           (char *)0x0,(char *)0x0);
                bVar4 = true;
                PrintGeneratorList(this);
              }
              else {
                bVar4 = true;
                SetGlobalGenerator(this,gg);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1118._M_dataplus._M_p != &local_1118.field_2) {
              operator_delete(local_1118._M_dataplus._M_p,
                              local_1118.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            bVar3 = cmsys::SystemTools::FileIsFullPath(local_1038[0]._M_dataplus._M_p);
            if (!bVar3) {
              std::__cxx11::string::_M_assign((string *)&local_10f8);
              std::__cxx11::string::append((char *)&local_10f8);
            }
            std::__cxx11::string::_M_append
                      ((char *)&local_10f8,(ulong)local_1038[0]._M_dataplus._M_p);
            bVar4 = true;
            bVar3 = false;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1038[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_1038[0]._M_dataplus._M_p,
                          local_1038[0].field_2._M_allocated_capacity + 1);
        }
        if (!bVar4) {
          iVar5 = -1;
          goto LAB_0024266f;
        }
        uVar12 = (ulong)(uVar11 + 1);
        pbVar6 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar12 < (ulong)((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >>
                               5));
    }
    AddCMakePaths(this);
    this_00 = this->State;
    local_1038[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"CMAKE_ROOT","");
    pcVar8 = cmState::GetInitializedCacheValue(this_00,local_1038);
    std::__cxx11::string::string((string *)&local_1118,pcVar8,(allocator *)&local_10b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1038[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1038[0]._M_dataplus._M_p,local_1038[0].field_2._M_allocated_capacity + 1
                     );
    }
    std::__cxx11::string::append((char *)&local_1118);
    local_10b8 = local_10a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_10b8,local_1118._M_dataplus._M_p,
               local_1118._M_dataplus._M_p + local_1118._M_string_length);
    std::__cxx11::string::append((char *)&local_10b8);
    local_10d8 = local_10c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_10d8,local_1138._M_dataplus._M_p,
               local_1138._M_dataplus._M_p + local_1138._M_string_length);
    std::__cxx11::string::append((char *)&local_10d8);
    bVar4 = cmSystemTools::cmCopyFile((char *)local_10b8,(char *)local_10d8);
    if (bVar4) {
      if (local_10f8._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&local_10f8);
        std::__cxx11::string::append((char *)&local_10f8);
      }
      cmsys::SystemTools::ChangeDirectory(&local_1138);
      local_1078.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1078.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1078.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_1078,
                  (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_1078,&local_1138);
      local_1058._M_dataplus._M_p = (pointer)&local_1058.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1058,"-DRESULT_FILE=","");
      std::__cxx11::string::_M_append((char *)&local_1058,(ulong)local_10f8._M_dataplus._M_p);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_1078,&local_1058);
      iVar5 = Run(this,&local_1078,false);
      if (iVar5 == 0) {
        cmsys::SystemTools::ChangeDirectory(&local_1098);
        if ((bVar3) &&
           (__stream = (FILE *)cmsys::SystemTools::Fopen(&local_10f8,"r"), __stream != (FILE *)0x0))
        {
          sVar10 = fread(local_1038,1,0x1000,__stream);
          while (sVar10 != 0) {
            if (0 < (long)sVar10) {
              psVar13 = local_1038;
              do {
                putc((int)*(char *)&(psVar13->_M_dataplus)._M_p,_stdout);
                psVar13 = (string *)((long)&(psVar13->_M_dataplus)._M_p + 1);
              } while (psVar13 < (string *)((long)&local_1038[0]._M_dataplus._M_p + sVar10));
            }
            fflush(_stdout);
            sVar10 = fread(local_1038,1,0x1000,__stream);
          }
          fclose(__stream);
        }
        iVar5 = 0;
        cmsys::SystemTools::RemoveADirectory(&local_1138);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error: --system-information failed on internal CMake!\n",
                   0x36);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
        operator_delete(local_1058._M_dataplus._M_p,local_1058.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1078);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error copying file \"",0x14);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_10b8,local_10b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" to \"",6);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(char *)local_10d8,local_10d0);
      iVar5 = 1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\".\n",3);
    }
    if (local_10d8 != local_10c8) {
      operator_delete(local_10d8,local_10c8[0] + 1);
    }
    if (local_10b8 != local_10a8) {
      operator_delete(local_10b8,local_10a8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1118._M_dataplus._M_p != &local_1118.field_2) {
      operator_delete(local_1118._M_dataplus._M_p,local_1118.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar5 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Error: --system-information must be run from a writable directory!\n",0x43);
  }
LAB_0024266f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1138._M_dataplus._M_p != &local_1138.field_2) {
    operator_delete(local_1138._M_dataplus._M_p,local_1138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1098._M_dataplus._M_p != &local_1098.field_2) {
    operator_delete(local_1098._M_dataplus._M_p,local_1098.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10f8._M_dataplus._M_p != &local_10f8.field_2) {
    operator_delete(local_10f8._M_dataplus._M_p,
                    CONCAT71(local_10f8.field_2._M_allocated_capacity._1_7_,
                             local_10f8.field_2._M_local_buf[0]) + 1);
  }
  return iVar5;
}

Assistant:

int cmake::GetSystemInformation(std::vector<std::string>& args)
{
  // so create the directory
  std::string resultFile;
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  std::string destPath = cwd + "/__cmake_systeminformation";
  cmSystemTools::RemoveADirectory(destPath);
  if (!cmSystemTools::MakeDirectory(destPath.c_str()))
    {
    std::cerr << "Error: --system-information must be run from a "
      "writable directory!\n";
    return 1;
    }

  // process the arguments
  bool writeToStdout = true;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    std::string arg = args[i];
    if(arg.find("-V",0) == 0)
      {
      this->Verbose = true;
      }
    else if(arg.find("-G",0) == 0)
      {
      std::string value = arg.substr(2);
      if(value.empty())
        {
        ++i;
        if(i >= args.size())
          {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return -1;
          }
        value = args[i];
        }
      cmGlobalGenerator* gen =
        this->CreateGlobalGenerator(value);
      if(!gen)
        {
        cmSystemTools::Error("Could not create named generator ",
                             value.c_str());
        this->PrintGeneratorList();
        }
      else
        {
        this->SetGlobalGenerator(gen);
        }
      }
    // no option assume it is the output file
    else
      {
      if (!cmSystemTools::FileIsFullPath(arg.c_str()))
        {
        resultFile = cwd;
        resultFile += "/";
        }
      resultFile += arg;
      writeToStdout = false;
      }
    }


  // we have to find the module directory, so we can copy the files
  this->AddCMakePaths();
  std::string modulesPath =
    this->State->GetInitializedCacheValue("CMAKE_ROOT");
  modulesPath += "/Modules";
  std::string inFile = modulesPath;
  inFile += "/SystemInformation.cmake";
  std::string outFile = destPath;
  outFile += "/CMakeLists.txt";

  // Copy file
  if(!cmSystemTools::cmCopyFile(inFile.c_str(), outFile.c_str()))
    {
    std::cerr << "Error copying file \"" << inFile
              << "\" to \"" << outFile << "\".\n";
    return 1;
    }

  // do we write to a file or to stdout?
  if (resultFile.empty())
    {
    resultFile = cwd;
    resultFile += "/__cmake_systeminformation/results.txt";
    }

  // now run cmake on the CMakeLists file
  cmSystemTools::ChangeDirectory(destPath);
  std::vector<std::string> args2;
  args2.push_back(args[0]);
  args2.push_back(destPath);
  std::string resultArg = "-DRESULT_FILE=";
  resultArg += resultFile;
  args2.push_back(resultArg);
  int res = this->Run(args2, false);

  if (res != 0)
    {
    std::cerr << "Error: --system-information failed on internal CMake!\n";
    return res;
    }

  // change back to the original directory
  cmSystemTools::ChangeDirectory(cwd);

  // echo results to stdout if needed
  if (writeToStdout)
    {
    FILE* fin = cmsys::SystemTools::Fopen(resultFile, "r");
    if(fin)
      {
      const int bufferSize = 4096;
      char buffer[bufferSize];
      size_t n;
      while((n = fread(buffer, 1, bufferSize, fin)) > 0)
        {
        for(char* c = buffer; c < buffer+n; ++c)
          {
          putc(*c, stdout);
          }
        fflush(stdout);
        }
      fclose(fin);
      }
    }

  // clean up the directory
  cmSystemTools::RemoveADirectory(destPath);
  return 0;
}